

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::DynamicMapField::AllocateMapValue
          (DynamicMapField *this,MapValueRef *map_val)

{
  int iVar1;
  CppType CVar2;
  undefined4 extraout_var;
  FieldDescriptor *this_00;
  Message *pMVar3;
  undefined4 extraout_var_00;
  undefined8 *puVar4;
  Reflection *this_01;
  type_info *ptVar5;
  Arena *pAVar6;
  
  iVar1 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x13])();
  this_00 = Descriptor::map_value((Descriptor *)CONCAT44(extraout_var,iVar1));
  CVar2 = FieldDescriptor::cpp_type(this_00);
  map_val->type_ = CVar2;
  CVar2 = FieldDescriptor::cpp_type(this_00);
  switch(CVar2) {
  case CPPTYPE_INT32:
  case CPPTYPE_ENUM:
    pAVar6 = (this->
             super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>)
             .super_MapFieldBase.arena_;
    if (pAVar6 == (Arena *)0x0) goto LAB_002ff963;
    ptVar5 = (type_info *)&int::typeinfo;
LAB_002ff947:
    Arena::AllocHook(pAVar6,ptVar5,8);
    puVar4 = (undefined8 *)Arena::AllocateAlignedNoHook(pAVar6,8);
    goto LAB_002ff96b;
  case CPPTYPE_INT64:
    pAVar6 = (this->
             super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>)
             .super_MapFieldBase.arena_;
    if (pAVar6 == (Arena *)0x0) goto LAB_002ff929;
    ptVar5 = (type_info *)&long::typeinfo;
LAB_002ff90d:
    Arena::AllocHook(pAVar6,ptVar5,8);
    puVar4 = (undefined8 *)Arena::AllocateAlignedNoHook(pAVar6,8);
    goto LAB_002ff931;
  case CPPTYPE_UINT32:
    pAVar6 = (this->
             super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>)
             .super_MapFieldBase.arena_;
    if (pAVar6 != (Arena *)0x0) {
      ptVar5 = (type_info *)&unsigned_int::typeinfo;
      goto LAB_002ff947;
    }
    goto LAB_002ff963;
  case CPPTYPE_UINT64:
    pAVar6 = (this->
             super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>)
             .super_MapFieldBase.arena_;
    if (pAVar6 != (Arena *)0x0) {
      ptVar5 = (type_info *)&unsigned_long::typeinfo;
      goto LAB_002ff90d;
    }
    goto LAB_002ff929;
  case CPPTYPE_DOUBLE:
    pAVar6 = (this->
             super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>)
             .super_MapFieldBase.arena_;
    if (pAVar6 != (Arena *)0x0) {
      ptVar5 = (type_info *)&double::typeinfo;
      goto LAB_002ff90d;
    }
LAB_002ff929:
    puVar4 = (undefined8 *)operator_new(8);
LAB_002ff931:
    *puVar4 = 0;
    break;
  case CPPTYPE_FLOAT:
    pAVar6 = (this->
             super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>)
             .super_MapFieldBase.arena_;
    if (pAVar6 != (Arena *)0x0) {
      ptVar5 = (type_info *)&float::typeinfo;
      goto LAB_002ff947;
    }
LAB_002ff963:
    puVar4 = (undefined8 *)operator_new(4);
LAB_002ff96b:
    *(undefined4 *)puVar4 = 0;
    break;
  case CPPTYPE_BOOL:
    pAVar6 = (this->
             super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>)
             .super_MapFieldBase.arena_;
    if (pAVar6 == (Arena *)0x0) {
      puVar4 = (undefined8 *)operator_new(1);
    }
    else {
      Arena::AllocHook(pAVar6,(type_info *)&bool::typeinfo,8);
      puVar4 = (undefined8 *)Arena::AllocateAlignedNoHook(pAVar6,8);
    }
    *(undefined1 *)puVar4 = 0;
    break;
  case CPPTYPE_STRING:
    pAVar6 = (this->
             super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>)
             .super_MapFieldBase.arena_;
    if (pAVar6 == (Arena *)0x0) {
      puVar4 = (undefined8 *)operator_new(0x20);
    }
    else {
      Arena::AllocHook(pAVar6,(type_info *)&std::__cxx11::string::typeinfo,0x20);
      puVar4 = (undefined8 *)
               ArenaImpl::AllocateAlignedAndAddCleanup
                         (&pAVar6->impl_,0x20,arena_destruct_object<std::__cxx11::string>);
    }
    *puVar4 = puVar4 + 2;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    break;
  case CPPTYPE_MESSAGE:
    (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x13])();
    pMVar3 = Reflection::GetMessage(this_01,this->default_entry_,this_00,(MessageFactory *)0x0);
    iVar1 = (*(pMVar3->super_MessageLite)._vptr_MessageLite[4])
                      (pMVar3,(this->
                              super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                              ).super_MapFieldBase.arena_);
    puVar4 = (undefined8 *)CONCAT44(extraout_var_00,iVar1);
    break;
  default:
    goto switchD_002ff83e_default;
  }
  map_val->data_ = puVar4;
switchD_002ff83e_default:
  return;
}

Assistant:

void DynamicMapField::AllocateMapValue(MapValueRef* map_val) {
  const FieldDescriptor* val_des = default_entry_->GetDescriptor()->map_value();
  map_val->SetType(val_des->cpp_type());
  // Allocate memory for the MapValueRef, and initialize to
  // default value.
  switch (val_des->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, TYPE)                           \
  case FieldDescriptor::CPPTYPE_##CPPTYPE: {                 \
    TYPE* value = Arena::Create<TYPE>(MapFieldBase::arena_); \
    map_val->SetValue(value);                                \
    break;                                                   \
  }
    HANDLE_TYPE(INT32, int32);
    HANDLE_TYPE(INT64, int64);
    HANDLE_TYPE(UINT32, uint32);
    HANDLE_TYPE(UINT64, uint64);
    HANDLE_TYPE(DOUBLE, double);
    HANDLE_TYPE(FLOAT, float);
    HANDLE_TYPE(BOOL, bool);
    HANDLE_TYPE(STRING, std::string);
    HANDLE_TYPE(ENUM, int32);
#undef HANDLE_TYPE
    case FieldDescriptor::CPPTYPE_MESSAGE: {
      const Message& message =
          default_entry_->GetReflection()->GetMessage(*default_entry_, val_des);
      Message* value = message.New(MapFieldBase::arena_);
      map_val->SetValue(value);
      break;
    }
  }
}